

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page-queue.c
# Opt level: O0

void mi_page_queue_push(mi_heap_t *heap,mi_page_queue_t *queue,mi_page_t *page)

{
  _Bool in_full;
  mi_page_t *in_RDX;
  mi_page_queue_t *in_RSI;
  long in_RDI;
  mi_page_queue_t *in_stack_00000028;
  mi_heap_t *in_stack_00000030;
  
  in_full = mi_page_queue_is_full(in_RSI);
  mi_page_set_in_full(in_RDX,in_full);
  in_RDX->next = in_RSI->first;
  in_RDX->prev = (mi_page_s *)0x0;
  if (in_RSI->first == (mi_page_t *)0x0) {
    in_RSI->last = in_RDX;
    in_RSI->first = in_RDX;
  }
  else {
    in_RSI->first->prev = in_RDX;
    in_RSI->first = in_RDX;
  }
  mi_heap_queue_first_update(in_stack_00000030,in_stack_00000028);
  *(long *)(in_RDI + 0xc0) = *(long *)(in_RDI + 0xc0) + 1;
  return;
}

Assistant:

static void mi_page_queue_push(mi_heap_t* heap, mi_page_queue_t* queue, mi_page_t* page) {
  mi_assert_internal(mi_page_heap(page) == heap);
  mi_assert_internal(!mi_page_queue_contains(queue, page));
  #if MI_HUGE_PAGE_ABANDON
  mi_assert_internal(_mi_page_segment(page)->kind != MI_SEGMENT_HUGE);
  #endif
  mi_assert_internal(mi_page_block_size(page) == queue->block_size ||
                      (mi_page_is_large_or_huge(page) && mi_page_queue_is_huge(queue)) ||
                        (mi_page_is_in_full(page) && mi_page_queue_is_full(queue)));

  mi_page_set_in_full(page, mi_page_queue_is_full(queue));
  // mi_atomic_store_ptr_release(mi_atomic_cast(void*, &page->heap), heap);
  page->next = queue->first;
  page->prev = NULL;
  if (queue->first != NULL) {
    mi_assert_internal(queue->first->prev == NULL);
    queue->first->prev = page;
    queue->first = page;
  }
  else {
    queue->first = queue->last = page;
  }

  // update direct
  mi_heap_queue_first_update(heap, queue);
  heap->page_count++;
}